

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_verifier.cpp
# Opt level: O1

FUNCTION_RETURN __thiscall
license::LicenseVerifier::verify_signature(LicenseVerifier *this,FullLicenseInfo *licInfo)

{
  FUNCTION_RETURN FVar1;
  LCC_EVENT_TYPE_conflict event;
  string licInfoData;
  string local_38;
  
  FullLicenseInfo::printForSign_abi_cxx11_(&local_38,licInfo);
  FVar1 = os::verify_signature(&local_38,&licInfo->license_signature);
  event = IFF_LOOPBACK;
  if (FVar1 == FUNC_RET_OK) {
    event = SIGNATURE_VERIFIED;
  }
  EventRegistry::addEvent(this->m_event_registry,event,&licInfo->source);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return FVar1;
}

Assistant:

FUNCTION_RETURN LicenseVerifier::verify_signature(const FullLicenseInfo& licInfo) {
	const string licInfoData(licInfo.printForSign());

	FUNCTION_RETURN ret = license::os::verify_signature(licInfoData, licInfo.license_signature);

	if (ret == FUNC_RET_OK) {
		m_event_registry.addEvent(SIGNATURE_VERIFIED, licInfo.source);
	} else {
		m_event_registry.addEvent(LICENSE_CORRUPTED, licInfo.source);
	}
	return ret;
}